

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Fx(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  uint fVeryVerbose;
  int iVar5;
  char *pcVar6;
  uint fReverse;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  local_44 = 1000000;
  fReverse = 0;
  local_3c = 0;
  fVeryVerbose = 0;
LAB_0027cd7d:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"NMrvwh"), iVar5 = globalUtilOptind, iVar1 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar1 < 0x4e) {
      if (iVar1 == -1) {
        pGVar3 = pAbc->pGia;
        if (pGVar3 == (Gia_Man_t *)0x0) {
          pcVar4 = "Abc_CommandAbc9Shrink(): There is no AIG.\n";
        }
        else {
          if (pGVar3->vMapping != (Vec_Int_t *)0x0) {
            pGVar3 = Gia_ManPerformFx(pGVar3,local_44,local_40,fReverse,local_3c,fVeryVerbose);
            if (pGVar3 != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc,pGVar3);
              return 0;
            }
            Abc_Print(-1,"Abc_CommandAbc9Fx(): Command has failed.\n");
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n";
        }
        iVar5 = -1;
        goto LAB_0027cf9e;
      }
      if (iVar1 != 0x4d) goto LAB_0027ced8;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
LAB_0027cecc:
        Abc_Print(-1,pcVar4);
        goto LAB_0027ced8;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_40 = uVar2;
    }
    else {
      if (iVar1 == 0x76) {
        local_3c = local_3c ^ 1;
        goto LAB_0027cd7d;
      }
      if (iVar1 == 0x72) {
        fReverse = fReverse ^ 1;
        goto LAB_0027cd7d;
      }
      if (iVar1 != 0x4e) goto LAB_0027ced8;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0027cecc;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0027ced8:
      Abc_Print(-2,"usage: &fx [-NM <num>] [-vh]\n");
      Abc_Print(-2,
                "\t           extract shared logic using the classical \"fast_extract\" algorithm\n"
               );
      Abc_Print(-2,"\t-N <num> : max number of divisors to extract during this run [default = %d]\n"
                ,(ulong)local_44);
      Abc_Print(-2,
                "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n",
                (ulong)local_40);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (fReverse == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r       : reversing variable order during ISOP computation [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_3c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar4);
      if (fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing additional information [default = %s]\n",pcVar6);
      pcVar4 = "\t-h       : print the command usage\n";
      iVar5 = -2;
LAB_0027cf9e:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Fx( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int nNewNodesMax = 1000000;
    int LitCountMax  =       0;
    int fReverse     =       0;
    int c, fVerbose  =       0;
    int fVeryVerbose =       0;
    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "NMrvwh")) != EOF )
    {
        switch (c)
        {
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                nNewNodesMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nNewNodesMax < 0 )
                    goto usage;
                break;
            case 'M':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                    goto usage;
                }
                LitCountMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( LitCountMax < 0 )
                    goto usage;
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'w':
                fVeryVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): There is no AIG.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pTemp = Gia_ManPerformFx( pAbc->pGia, nNewNodesMax, LitCountMax, fReverse, fVerbose, fVeryVerbose );
    if ( pTemp != NULL )
        Abc_FrameUpdateGia( pAbc, pTemp );
    else
        Abc_Print( -1, "Abc_CommandAbc9Fx(): Command has failed.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: &fx [-NM <num>] [-vh]\n");
    Abc_Print( -2, "\t           extract shared logic using the classical \"fast_extract\" algorithm\n");
    Abc_Print( -2, "\t-N <num> : max number of divisors to extract during this run [default = %d]\n", nNewNodesMax );
    Abc_Print( -2, "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n", LitCountMax );
    Abc_Print( -2, "\t-r       : reversing variable order during ISOP computation [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}